

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HtmlBuilder.h
# Opt level: O3

void __thiscall HTML::TAG::~TAG(TAG *this)

{
  pointer pcVar1;
  ostream *poVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long *local_30;
  long local_28;
  long local_20 [2];
  
  this->_vptr_TAG = (_func_int **)&PTR__TAG_001eb060;
  poVar2 = this->m_stream;
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_30,local_28);
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  poVar2 = this->m_stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"</",2);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(this->m_tag)._M_dataplus._M_p,(this->m_tag)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,">",1);
  std::__cxx11::stringstream::~stringstream((stringstream *)&this->m_value);
  std::ios_base::~ios_base((ios_base *)&this->field_0xa8);
  pcVar1 = (this->m_tag)._M_dataplus._M_p;
  paVar3 = &(this->m_tag).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

virtual ~TAG() 
  {
    m_stream << m_value.str();
    m_stream << "</" << m_tag << ">";
  }